

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_unnest_expression.cpp
# Opt level: O3

void __thiscall
duckdb::SelectBinder::ThrowIfUnnestInLambda(SelectBinder *this,ColumnBinding *column_binding)

{
  _Hash_node_base *p_Var1;
  BinderException *this_00;
  string local_40;
  
  p_Var1 = (((this->super_BaseSelectBinder).node)->unnests)._M_h._M_before_begin._M_nxt;
  if (p_Var1 != (_Hash_node_base *)0x0) {
    do {
      if ((p_Var1[2]._M_nxt == (_Hash_node_base *)column_binding->table_index) &&
         (column_binding->column_index <
          (ulong)((long)p_Var1[4]._M_nxt - (long)p_Var1[3]._M_nxt >> 3))) {
        this_00 = (BinderException *)__cxa_allocate_exception(0x10);
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"UNNEST in lambda expressions is not supported","");
        BinderException::BinderException(this_00,&local_40);
        __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      p_Var1 = p_Var1->_M_nxt;
    } while (p_Var1 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void SelectBinder::ThrowIfUnnestInLambda(const ColumnBinding &column_binding) {
	// Extract the unnests and check if any match the column index.
	for (auto &node_pair : node.unnests) {
		auto &unnest_node = node_pair.second;

		if (unnest_node.index == column_binding.table_index) {
			if (column_binding.column_index < unnest_node.expressions.size()) {
				throw BinderException("UNNEST in lambda expressions is not supported");
			}
		}
	}
}